

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack8to4.h
# Opt level: O0

void ncnn::deconvolution_pack8to4_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  long lVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  int iVar87;
  int iVar88;
  undefined8 *puVar89;
  long lVar90;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w7;
  __m128 _w6;
  __m128 _w5;
  __m128 _w4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  int local_25e8;
  int local_25dc;
  int local_258c;
  long local_2540;
  undefined8 local_2538;
  undefined8 uStack_2530;
  int local_2524;
  int local_2520;
  undefined8 *local_24b0;
  int local_24a4;
  float local_1ea8;
  float fStack_1ea4;
  float fStack_1ea0;
  float fStack_1e9c;
  undefined1 local_1e28 [8];
  undefined8 uStack_1e20;
  ulong uStack_1e10;
  float local_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float local_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float local_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float local_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float local_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  float local_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float local_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float local_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float local_1c08;
  float fStack_1c04;
  float fStack_1c00;
  float fStack_1bfc;
  float local_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  ulong uStack_1ab0;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a20;
  float fStack_1a1c;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  float local_1988;
  float fStack_1984;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float local_1548;
  float fStack_1544;
  float fStack_1540;
  float fStack_153c;
  float local_1528;
  float fStack_1524;
  float fStack_1520;
  float fStack_151c;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined1 local_738 [8];
  float fStack_730;
  float fStack_72c;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  
  lVar83 = in_RSI[7];
  lVar9 = *in_RCX;
  for (local_24a4 = 0; local_24a4 < (int)lVar83; local_24a4 = local_24a4 + 1) {
    local_24b0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_24a4 * in_RSI[2]);
    iVar7 = *(int *)((long)in_RDI + 0x2c);
    lVar84 = in_RDI[6];
    lVar85 = in_RDI[7];
    iVar8 = *(int *)((long)in_RSI + 0x2c);
    lVar86 = in_RSI[6];
    for (local_2520 = 0; local_2520 < (int)lVar86; local_2520 = local_2520 + 1) {
      for (local_2524 = 0; local_2524 < iVar8; local_2524 = local_2524 + 1) {
        local_2538 = 0;
        uStack_2530 = 0;
        if (lVar9 != 0) {
          puVar89 = (undefined8 *)(lVar9 + (long)(local_24a4 << 2) * 4);
          local_2538 = *puVar89;
          uStack_2530 = puVar89[1];
        }
        local_2540 = *in_RDX + in_RDX[8] * (long)local_24a4 * in_RDX[2];
        for (local_258c = 0; local_258c < (int)lVar85; local_258c = local_258c + 1) {
          for (local_25dc = 0; local_25dc < in_R9D; local_25dc = local_25dc + 1) {
            iVar87 = (local_2520 + local_25dc * in_stack_00000010) -
                     in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar87) && (iVar87 % in_stack_00000020 == 0)) &&
               (iVar87 / in_stack_00000020 < (int)lVar84)) {
              for (local_25e8 = 0; local_25e8 < in_R8D; local_25e8 = local_25e8 + 1) {
                iVar88 = (local_2524 + local_25e8 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar88) && (iVar88 % in_stack_00000018 == 0)) &&
                   (iVar88 / in_stack_00000018 < iVar7)) {
                  pfVar1 = (float *)(*in_RDI + in_RDI[8] * (long)local_258c * in_RDI[2] +
                                     (long)*(int *)((long)in_RDI + 0x2c) *
                                     (long)(iVar87 / in_stack_00000020) * in_RDI[2] +
                                    (long)(iVar88 / in_stack_00000018 << 3) * 4);
                  iVar88 = (local_25dc * in_R8D + local_25e8) * 0x20;
                  fVar91 = *pfVar1;
                  fVar92 = pfVar1[1];
                  fVar93 = pfVar1[2];
                  fVar94 = pfVar1[3];
                  fVar2 = pfVar1[4];
                  fVar3 = pfVar1[5];
                  fVar4 = pfVar1[6];
                  fVar5 = pfVar1[7];
                  puVar89 = (undefined8 *)(local_2540 + (long)iVar88 * 4);
                  uVar14 = *puVar89;
                  uVar15 = puVar89[1];
                  lVar90 = local_2540 + (long)iVar88 * 4;
                  uVar16 = *(undefined8 *)(lVar90 + 0x10);
                  uVar17 = *(undefined8 *)(lVar90 + 0x18);
                  lVar90 = local_2540 + (long)iVar88 * 4;
                  uVar18 = *(undefined8 *)(lVar90 + 0x20);
                  uVar19 = *(undefined8 *)(lVar90 + 0x28);
                  lVar90 = local_2540 + (long)iVar88 * 4;
                  uVar20 = *(undefined8 *)(lVar90 + 0x30);
                  uVar21 = *(undefined8 *)(lVar90 + 0x38);
                  lVar90 = local_2540 + (long)iVar88 * 4;
                  uVar22 = *(undefined8 *)(lVar90 + 0x40);
                  uVar23 = *(undefined8 *)(lVar90 + 0x48);
                  lVar90 = local_2540 + (long)iVar88 * 4;
                  uVar24 = *(undefined8 *)(lVar90 + 0x50);
                  uVar25 = *(undefined8 *)(lVar90 + 0x58);
                  lVar90 = local_2540 + (long)iVar88 * 4;
                  uVar26 = *(undefined8 *)(lVar90 + 0x60);
                  uVar27 = *(undefined8 *)(lVar90 + 0x68);
                  lVar90 = local_2540 + (long)iVar88 * 4;
                  uVar28 = *(undefined8 *)(lVar90 + 0x70);
                  uVar29 = *(undefined8 *)(lVar90 + 0x78);
                  local_1db8 = (float)uVar14;
                  fStack_1db4 = (float)((ulong)uVar14 >> 0x20);
                  fStack_1db0 = (float)uVar15;
                  fStack_1dac = (float)((ulong)uVar15 >> 0x20);
                  local_1ea8 = (float)local_2538;
                  fStack_1ea4 = (float)((ulong)local_2538 >> 0x20);
                  fStack_1ea0 = (float)uStack_2530;
                  fStack_1e9c = (float)((ulong)uStack_2530 >> 0x20);
                  local_1d98 = (float)uVar16;
                  fStack_1d94 = (float)((ulong)uVar16 >> 0x20);
                  fStack_1d90 = (float)uVar17;
                  fStack_1d8c = (float)((ulong)uVar17 >> 0x20);
                  local_1d78 = (float)uVar18;
                  fStack_1d74 = (float)((ulong)uVar18 >> 0x20);
                  fStack_1d70 = (float)uVar19;
                  fStack_1d6c = (float)((ulong)uVar19 >> 0x20);
                  local_1d58 = (float)uVar20;
                  fStack_1d54 = (float)((ulong)uVar20 >> 0x20);
                  fStack_1d50 = (float)uVar21;
                  fStack_1d4c = (float)((ulong)uVar21 >> 0x20);
                  local_1d38 = (float)uVar22;
                  fStack_1d34 = (float)((ulong)uVar22 >> 0x20);
                  fStack_1d30 = (float)uVar23;
                  fStack_1d2c = (float)((ulong)uVar23 >> 0x20);
                  local_1d18 = (float)uVar24;
                  fStack_1d14 = (float)((ulong)uVar24 >> 0x20);
                  fStack_1d10 = (float)uVar25;
                  fStack_1d0c = (float)((ulong)uVar25 >> 0x20);
                  local_1cf8 = (float)uVar26;
                  fStack_1cf4 = (float)((ulong)uVar26 >> 0x20);
                  fStack_1cf0 = (float)uVar27;
                  fStack_1cec = (float)((ulong)uVar27 >> 0x20);
                  local_1cd8 = (float)uVar28;
                  fStack_1cd4 = (float)((ulong)uVar28 >> 0x20);
                  fStack_1cd0 = (float)uVar29;
                  fStack_1ccc = (float)((ulong)uVar29 >> 0x20);
                  local_2538 = CONCAT44(fVar5 * fStack_1cd4 +
                                        fVar4 * fStack_1cf4 +
                                        fVar3 * fStack_1d14 +
                                        fVar2 * fStack_1d34 +
                                        fVar94 * fStack_1d54 +
                                        fVar93 * fStack_1d74 +
                                        fVar92 * fStack_1d94 + fVar91 * fStack_1db4 + fStack_1ea4,
                                        fVar5 * local_1cd8 +
                                        fVar4 * local_1cf8 +
                                        fVar3 * local_1d18 +
                                        fVar2 * local_1d38 +
                                        fVar94 * local_1d58 +
                                        fVar93 * local_1d78 +
                                        fVar92 * local_1d98 + fVar91 * local_1db8 + local_1ea8);
                  uStack_2530 = CONCAT44(fVar5 * fStack_1ccc +
                                         fVar4 * fStack_1cec +
                                         fVar3 * fStack_1d0c +
                                         fVar2 * fStack_1d2c +
                                         fVar94 * fStack_1d4c +
                                         fVar93 * fStack_1d6c +
                                         fVar92 * fStack_1d8c + fVar91 * fStack_1dac + fStack_1e9c,
                                         fVar5 * fStack_1cd0 +
                                         fVar4 * fStack_1cf0 +
                                         fVar3 * fStack_1d10 +
                                         fVar2 * fStack_1d30 +
                                         fVar94 * fStack_1d50 +
                                         fVar93 * fStack_1d70 +
                                         fVar92 * fStack_1d90 + fVar91 * fStack_1db0 + fStack_1ea0);
                }
              }
            }
          }
          local_2540 = local_2540 + (long)(in_R8D * in_R9D * 0x20) * 4;
        }
        fStack_1a20 = (float)uStack_2530;
        fStack_1a1c = (float)((ulong)uStack_2530 >> 0x20);
        local_1988 = (float)local_2538;
        fStack_1984 = (float)((ulong)local_2538 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          uStack_1e10 = SUB168(ZEXT816(0),4);
          auVar30._8_8_ = uStack_2530;
          auVar30._0_8_ = local_2538;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uStack_1e10;
          _local_1e28 = vmaxps_avx(auVar30,auVar81 << 0x40);
          break;
        case 2:
          fVar91 = *(float *)*in_stack_00000030;
          auVar33._8_8_ = uStack_2530;
          auVar33._0_8_ = local_2538;
          auVar12 = vmaxps_avx(ZEXT816(0),auVar33);
          auVar34._8_8_ = uStack_2530;
          auVar34._0_8_ = local_2538;
          auVar10 = vminps_avx(ZEXT816(0),auVar34);
          local_1bf8 = auVar10._0_4_;
          fStack_1bf4 = auVar10._4_4_;
          fStack_1bf0 = auVar10._8_4_;
          fStack_1bec = auVar10._12_4_;
          local_1c08 = auVar12._0_4_;
          fStack_1c04 = auVar12._4_4_;
          fStack_1c00 = auVar12._8_4_;
          fStack_1bfc = auVar12._12_4_;
          local_1e28._4_4_ = fStack_1c04 + fVar91 * fStack_1bf4;
          local_1e28._0_4_ = local_1c08 + fVar91 * local_1bf8;
          uStack_1e20._0_4_ = fStack_1c00 + fVar91 * fStack_1bf0;
          uStack_1e20._4_4_ = fStack_1bfc + fVar91 * fStack_1bec;
          break;
        case 3:
          uVar6 = *(undefined4 *)*in_stack_00000030;
          auVar31._4_4_ = uVar6;
          auVar31._0_4_ = uVar6;
          auVar31._12_4_ = uVar6;
          auVar31._8_4_ = uVar6;
          uVar6 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar35._4_4_ = uVar6;
          auVar35._0_4_ = uVar6;
          auVar35._12_4_ = uVar6;
          auVar35._8_4_ = uVar6;
          auVar32._8_8_ = uStack_2530;
          auVar32._0_8_ = local_2538;
          auVar12 = vmaxps_avx(auVar32,auVar31);
          _local_1e28 = vminps_avx(auVar12,auVar35);
          break;
        case 4:
          auVar36._8_8_ = 0x3f8000003f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          uStack_1ab0 = SUB168(ZEXT816(0),4);
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uStack_1ab0;
          auVar45._8_8_ = uStack_2530;
          auVar45._0_8_ = local_2538;
          auVar12 = vsubps_avx(auVar82 << 0x40,auVar45);
          auVar44._8_8_ = 0x42b0c0a542b0c0a5;
          auVar44._0_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar44);
          auVar43._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar43);
          local_1138 = auVar11._0_4_;
          fStack_1134 = auVar11._4_4_;
          fStack_1130 = auVar11._8_4_;
          fStack_112c = auVar11._12_4_;
          fVar91 = local_1138 * 1.442695 + 0.5;
          fVar92 = fStack_1134 * 1.442695 + 0.5;
          fVar93 = fStack_1130 * 1.442695 + 0.5;
          fVar94 = fStack_112c * 1.442695 + 0.5;
          local_1488 = CONCAT44(fVar92,fVar91);
          uStack_1480._0_4_ = fVar93;
          uStack_1480._4_4_ = fVar94;
          local_1498 = CONCAT44((int)fVar92,(int)fVar91);
          uStack_1490._0_4_ = (int)fVar93;
          uStack_1490._4_4_ = (int)fVar94;
          auVar46._8_8_ = uStack_1490;
          auVar46._0_8_ = local_1498;
          auVar10 = vcvtdq2ps_avx(auVar46);
          auVar48._8_8_ = uStack_1480;
          auVar48._0_8_ = local_1488;
          auVar12 = vcmpps_avx(auVar48,auVar10,1);
          auVar50._8_8_ = 0x3f8000003f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar12 = vpand_avx(auVar12,auVar50);
          auVar12 = vsubps_avx(auVar10,auVar12);
          local_f18 = auVar12._0_4_;
          fStack_f14 = auVar12._4_4_;
          fStack_f10 = auVar12._8_4_;
          fStack_f0c = auVar12._12_4_;
          auVar53._4_4_ = fStack_f14 * 0.6933594;
          auVar53._0_4_ = local_f18 * 0.6933594;
          auVar53._8_4_ = fStack_f10 * 0.6933594;
          auVar53._12_4_ = fStack_f0c * 0.6933594;
          auVar12 = vsubps_avx(auVar11,auVar53);
          auVar52._4_4_ = fStack_f14 * -0.00021219444;
          auVar52._0_4_ = local_f18 * -0.00021219444;
          auVar52._8_4_ = fStack_f10 * -0.00021219444;
          auVar52._12_4_ = fStack_f0c * -0.00021219444;
          auVar12 = vsubps_avx(auVar12,auVar52);
          local_1158 = auVar12._0_4_;
          fStack_1154 = auVar12._4_4_;
          fStack_1150 = auVar12._8_4_;
          fStack_114c = auVar12._12_4_;
          local_1498 = CONCAT44((int)fStack_f14,(int)local_f18);
          uStack_1490._0_4_ = (int)fStack_f10;
          uStack_1490._4_4_ = (int)fStack_f0c;
          auVar42._8_8_ = uStack_1490;
          auVar42._0_8_ = local_1498;
          auVar41._8_8_ = 0x7f0000007f;
          auVar41._0_8_ = 0x7f0000007f;
          auVar12 = vpaddd_avx(auVar42,auVar41);
          auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
          local_1188 = auVar12._0_4_;
          fStack_1184 = auVar12._4_4_;
          fStack_1180 = auVar12._8_4_;
          fStack_117c = auVar12._12_4_;
          auVar37._4_4_ =
               ((((((fStack_1154 * 0.00019875691 + 0.0013981999) * fStack_1154 + 0.008333452) *
                   fStack_1154 + 0.041665796) * fStack_1154 + 0.16666666) * fStack_1154 + 0.5) *
                fStack_1154 * fStack_1154 + fStack_1154 + 1.0) * fStack_1184 + 1.0;
          auVar37._0_4_ =
               ((((((local_1158 * 0.00019875691 + 0.0013981999) * local_1158 + 0.008333452) *
                   local_1158 + 0.041665796) * local_1158 + 0.16666666) * local_1158 + 0.5) *
                local_1158 * local_1158 + local_1158 + 1.0) * local_1188 + 1.0;
          auVar37._8_4_ =
               ((((((fStack_1150 * 0.00019875691 + 0.0013981999) * fStack_1150 + 0.008333452) *
                   fStack_1150 + 0.041665796) * fStack_1150 + 0.16666666) * fStack_1150 + 0.5) *
                fStack_1150 * fStack_1150 + fStack_1150 + 1.0) * fStack_1180 + 1.0;
          auVar37._12_4_ =
               ((((((fStack_114c * 0.00019875691 + 0.0013981999) * fStack_114c + 0.008333452) *
                   fStack_114c + 0.041665796) * fStack_114c + 0.16666666) * fStack_114c + 0.5) *
                fStack_114c * fStack_114c + fStack_114c + 1.0) * fStack_117c + 1.0;
          _local_1e28 = vdivps_avx(auVar36,auVar37);
          break;
        case 5:
          auVar40._8_8_ = uStack_2530;
          auVar40._0_8_ = local_2538;
          auVar39._8_8_ = 0x42b0c0a542b0c0a5;
          auVar39._0_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar40,auVar39);
          auVar38._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar12,auVar38);
          local_1528 = auVar11._0_4_;
          fStack_1524 = auVar11._4_4_;
          fStack_1520 = auVar11._8_4_;
          fStack_151c = auVar11._12_4_;
          fVar91 = local_1528 * 1.442695 + 0.5;
          fVar92 = fStack_1524 * 1.442695 + 0.5;
          fVar93 = fStack_1520 * 1.442695 + 0.5;
          fVar94 = fStack_151c * 1.442695 + 0.5;
          local_1878 = CONCAT44(fVar92,fVar91);
          uStack_1870._0_4_ = fVar93;
          uStack_1870._4_4_ = fVar94;
          local_1888 = CONCAT44((int)fVar92,(int)fVar91);
          uStack_1880._0_4_ = (int)fVar93;
          uStack_1880._4_4_ = (int)fVar94;
          auVar47._8_8_ = uStack_1880;
          auVar47._0_8_ = local_1888;
          auVar10 = vcvtdq2ps_avx(auVar47);
          auVar49._8_8_ = uStack_1870;
          auVar49._0_8_ = local_1878;
          auVar12 = vcmpps_avx(auVar49,auVar10,1);
          auVar51._8_8_ = 0x3f8000003f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar12 = vpand_avx(auVar12,auVar51);
          auVar12 = vsubps_avx(auVar10,auVar12);
          local_e58 = auVar12._0_4_;
          fStack_e54 = auVar12._4_4_;
          fStack_e50 = auVar12._8_4_;
          fStack_e4c = auVar12._12_4_;
          auVar55._4_4_ = fStack_e54 * 0.6933594;
          auVar55._0_4_ = local_e58 * 0.6933594;
          auVar55._8_4_ = fStack_e50 * 0.6933594;
          auVar55._12_4_ = fStack_e4c * 0.6933594;
          auVar12 = vsubps_avx(auVar11,auVar55);
          auVar54._4_4_ = fStack_e54 * -0.00021219444;
          auVar54._0_4_ = local_e58 * -0.00021219444;
          auVar54._8_4_ = fStack_e50 * -0.00021219444;
          auVar54._12_4_ = fStack_e4c * -0.00021219444;
          auVar12 = vsubps_avx(auVar12,auVar54);
          local_1548 = auVar12._0_4_;
          fStack_1544 = auVar12._4_4_;
          fStack_1540 = auVar12._8_4_;
          fStack_153c = auVar12._12_4_;
          local_1888 = CONCAT44((int)fStack_e54,(int)local_e58);
          uStack_1880._0_4_ = (int)fStack_e50;
          uStack_1880._4_4_ = (int)fStack_e4c;
          auVar13._8_8_ = uStack_1880;
          auVar13._0_8_ = local_1888;
          auVar11._8_8_ = 0x7f0000007f;
          auVar11._0_8_ = 0x7f0000007f;
          auVar12 = vpaddd_avx(auVar13,auVar11);
          auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
          local_1578 = auVar12._0_4_;
          fStack_1574 = auVar12._4_4_;
          fStack_1570 = auVar12._8_4_;
          fStack_156c = auVar12._12_4_;
          local_6b8 = CONCAT44(((((((fStack_1544 * 0.00019875691 + 0.0013981999) * fStack_1544 +
                                   0.008333452) * fStack_1544 + 0.041665796) * fStack_1544 +
                                 0.16666666) * fStack_1544 + 0.5) * fStack_1544 * fStack_1544 +
                                fStack_1544 + 1.0) * fStack_1574 + 1.0,
                               ((((((local_1548 * 0.00019875691 + 0.0013981999) * local_1548 +
                                   0.008333452) * local_1548 + 0.041665796) * local_1548 +
                                 0.16666666) * local_1548 + 0.5) * local_1548 * local_1548 +
                                local_1548 + 1.0) * local_1578 + 1.0);
          uStack_6b0._0_4_ =
               ((((((fStack_1540 * 0.00019875691 + 0.0013981999) * fStack_1540 + 0.008333452) *
                   fStack_1540 + 0.041665796) * fStack_1540 + 0.16666666) * fStack_1540 + 0.5) *
                fStack_1540 * fStack_1540 + fStack_1540 + 1.0) * fStack_1570 + 1.0;
          uStack_6b0._4_4_ =
               ((((((fStack_153c * 0.00019875691 + 0.0013981999) * fStack_153c + 0.008333452) *
                   fStack_153c + 0.041665796) * fStack_153c + 0.16666666) * fStack_153c + 0.5) *
                fStack_153c * fStack_153c + fStack_153c + 1.0) * fStack_156c + 1.0;
          auVar77._8_8_ = uStack_6b0;
          auVar77._0_8_ = local_6b8;
          auVar12 = vcmpps_avx(auVar77,ZEXT816(0),2);
          auVar71._8_8_ = uStack_6b0;
          auVar71._0_8_ = local_6b8;
          auVar70._8_8_ = 0x80000000800000;
          auVar70._0_8_ = 0x80000000800000;
          auVar10 = vmaxps_avx(auVar71,auVar70);
          auVar11 = vpsrld_avx(auVar10,ZEXT416(0x17));
          auVar75._8_8_ = 0x807fffff807fffff;
          auVar75._0_8_ = 0x807fffff807fffff;
          auVar10 = vpand_avx(auVar10,auVar75);
          auVar79._8_8_ = 0x3f0000003f000000;
          auVar79._0_8_ = 0x3f0000003f000000;
          auVar13 = vpor_avx(auVar10,auVar79);
          auVar69._8_8_ = 0x7f0000007f;
          auVar69._0_8_ = 0x7f0000007f;
          auVar10 = vpsubd_avx(auVar11,auVar69);
          auVar10 = vcvtdq2ps_avx(auVar10);
          local_648 = auVar10._0_4_;
          fStack_644 = auVar10._4_4_;
          fStack_640 = auVar10._8_4_;
          fStack_63c = auVar10._12_4_;
          local_6f8 = CONCAT44(fStack_644 + 1.0,local_648 + 1.0);
          uStack_6f0._0_4_ = fStack_640 + 1.0;
          uStack_6f0._4_4_ = fStack_63c + 1.0;
          auVar80._8_8_ = 0x3f3504f33f3504f3;
          auVar80._0_8_ = 0x3f3504f33f3504f3;
          auVar10 = vcmpps_avx(auVar13,auVar80,1);
          auVar11 = vpand_avx(auVar13,auVar10);
          auVar73._8_8_ = 0x3f8000003f800000;
          auVar73._0_8_ = 0x3f8000003f800000;
          auVar13 = vsubps_avx(auVar13,auVar73);
          auVar74._8_8_ = 0x3f8000003f800000;
          auVar74._0_8_ = 0x3f8000003f800000;
          auVar10 = vpand_avx(auVar10,auVar74);
          auVar72._8_8_ = uStack_6f0;
          auVar72._0_8_ = local_6f8;
          auVar10 = vsubps_avx(auVar72,auVar10);
          local_668 = auVar13._0_4_;
          fStack_664 = auVar13._4_4_;
          fStack_660 = auVar13._8_4_;
          fStack_65c = auVar13._12_4_;
          local_678 = auVar11._0_4_;
          fStack_674 = auVar11._4_4_;
          fStack_670 = auVar11._8_4_;
          fStack_66c = auVar11._12_4_;
          local_668 = local_668 + local_678;
          fStack_664 = fStack_664 + fStack_674;
          fStack_660 = fStack_660 + fStack_670;
          fStack_65c = fStack_65c + fStack_66c;
          local_268 = auVar10._0_4_;
          fStack_264 = auVar10._4_4_;
          fStack_260 = auVar10._8_4_;
          fStack_25c = auVar10._12_4_;
          local_738._4_4_ =
               fStack_264 * -0.00021219444 +
               ((((((((fStack_664 * 0.070376836 + -0.1151461) * fStack_664 + 0.116769984) *
                     fStack_664 + -0.12420141) * fStack_664 + 0.14249323) * fStack_664 + -0.16668057
                  ) * fStack_664 + 0.20000714) * fStack_664 + -0.24999994) * fStack_664 + 0.3333333)
               * fStack_664 * fStack_664 * fStack_664;
          local_738._0_4_ =
               local_268 * -0.00021219444 +
               ((((((((local_668 * 0.070376836 + -0.1151461) * local_668 + 0.116769984) * local_668
                    + -0.12420141) * local_668 + 0.14249323) * local_668 + -0.16668057) * local_668
                 + 0.20000714) * local_668 + -0.24999994) * local_668 + 0.3333333) * local_668 *
               local_668 * local_668;
          fStack_730 = fStack_260 * -0.00021219444 +
                       ((((((((fStack_660 * 0.070376836 + -0.1151461) * fStack_660 + 0.116769984) *
                             fStack_660 + -0.12420141) * fStack_660 + 0.14249323) * fStack_660 +
                          -0.16668057) * fStack_660 + 0.20000714) * fStack_660 + -0.24999994) *
                        fStack_660 + 0.3333333) * fStack_660 * fStack_660 * fStack_660;
          fStack_72c = fStack_25c * -0.00021219444 +
                       ((((((((fStack_65c * 0.070376836 + -0.1151461) * fStack_65c + 0.116769984) *
                             fStack_65c + -0.12420141) * fStack_65c + 0.14249323) * fStack_65c +
                          -0.16668057) * fStack_65c + 0.20000714) * fStack_65c + -0.24999994) *
                        fStack_65c + 0.3333333) * fStack_65c * fStack_65c * fStack_65c;
          auVar76._4_4_ = fStack_664 * fStack_664 * 0.5;
          auVar76._0_4_ = local_668 * local_668 * 0.5;
          auVar76._8_4_ = fStack_660 * fStack_660 * 0.5;
          auVar76._12_4_ = fStack_65c * fStack_65c * 0.5;
          auVar10 = vsubps_avx(_local_738,auVar76);
          local_698 = auVar10._0_4_;
          fStack_694 = auVar10._4_4_;
          fStack_690 = auVar10._8_4_;
          fStack_68c = auVar10._12_4_;
          local_6b8 = CONCAT44(fStack_264 * 0.6933594 + fStack_664 + fStack_694,
                               local_268 * 0.6933594 + local_668 + local_698);
          uStack_6b0._0_4_ = fStack_260 * 0.6933594 + fStack_660 + fStack_690;
          uStack_6b0._4_4_ = fStack_25c * 0.6933594 + fStack_65c + fStack_68c;
          auVar78._8_8_ = uStack_6b0;
          auVar78._0_8_ = local_6b8;
          auVar12 = vpor_avx(auVar78,auVar12);
          local_da8 = auVar12._0_4_;
          fStack_da4 = auVar12._4_4_;
          fStack_da0 = auVar12._8_4_;
          fStack_d9c = auVar12._12_4_;
          auVar62._4_4_ = fStack_da4 * 2.0;
          auVar62._0_4_ = local_da8 * 2.0;
          auVar62._12_4_ = fStack_d9c * 2.0;
          auVar62._8_4_ = fStack_da0 * 2.0;
          auVar12 = vsubps_avx(ZEXT816(0),auVar62);
          auVar61._8_8_ = 0x42b0c0a542b0c0a5;
          auVar61._0_8_ = 0x42b0c0a542b0c0a5;
          auVar12 = vminps_avx(auVar12,auVar61);
          auVar60._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar60._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar11 = vmaxps_avx(auVar60,auVar12);
          local_928 = auVar11._0_4_;
          fStack_924 = auVar11._4_4_;
          fStack_920 = auVar11._8_4_;
          fStack_91c = auVar11._12_4_;
          fVar91 = local_928 * 1.442695 + 0.5;
          fVar92 = fStack_924 * 1.442695 + 0.5;
          fVar93 = fStack_920 * 1.442695 + 0.5;
          fVar94 = fStack_91c * 1.442695 + 0.5;
          local_c78 = CONCAT44(fVar92,fVar91);
          uStack_c70._0_4_ = fVar93;
          uStack_c70._4_4_ = fVar94;
          local_c88 = CONCAT44((int)fVar92,(int)fVar91);
          uStack_c80._0_4_ = (int)fVar93;
          uStack_c80._4_4_ = (int)fVar94;
          auVar64._8_8_ = uStack_c80;
          auVar64._0_8_ = local_c88;
          auVar10 = vcvtdq2ps_avx(auVar64);
          auVar65._8_8_ = uStack_c70;
          auVar65._0_8_ = local_c78;
          auVar12 = vcmpps_avx(auVar65,auVar10,1);
          auVar66._8_8_ = 0x3f8000003f800000;
          auVar66._0_8_ = 0x3f8000003f800000;
          auVar12 = vpand_avx(auVar12,auVar66);
          auVar12 = vsubps_avx(auVar10,auVar12);
          local_778 = auVar12._0_4_;
          fStack_774 = auVar12._4_4_;
          fStack_770 = auVar12._8_4_;
          fStack_76c = auVar12._12_4_;
          auVar68._4_4_ = fStack_774 * 0.6933594;
          auVar68._0_4_ = local_778 * 0.6933594;
          auVar68._8_4_ = fStack_770 * 0.6933594;
          auVar68._12_4_ = fStack_76c * 0.6933594;
          auVar12 = vsubps_avx(auVar11,auVar68);
          auVar67._4_4_ = fStack_774 * -0.00021219444;
          auVar67._0_4_ = local_778 * -0.00021219444;
          auVar67._8_4_ = fStack_770 * -0.00021219444;
          auVar67._12_4_ = fStack_76c * -0.00021219444;
          auVar12 = vsubps_avx(auVar12,auVar67);
          local_948 = auVar12._0_4_;
          fStack_944 = auVar12._4_4_;
          fStack_940 = auVar12._8_4_;
          fStack_93c = auVar12._12_4_;
          local_c88 = CONCAT44((int)fStack_774,(int)local_778);
          uStack_c80._0_4_ = (int)fStack_770;
          uStack_c80._4_4_ = (int)fStack_76c;
          auVar59._8_8_ = uStack_c80;
          auVar59._0_8_ = local_c88;
          auVar58._8_8_ = 0x7f0000007f;
          auVar58._0_8_ = 0x7f0000007f;
          auVar12 = vpaddd_avx(auVar59,auVar58);
          auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
          local_978 = auVar12._0_4_;
          fStack_974 = auVar12._4_4_;
          fStack_970 = auVar12._8_4_;
          fStack_96c = auVar12._12_4_;
          auVar57._8_8_ = 0x3f8000003f800000;
          auVar57._0_8_ = 0x3f8000003f800000;
          auVar56._4_4_ =
               ((((((fStack_944 * 0.00019875691 + 0.0013981999) * fStack_944 + 0.008333452) *
                   fStack_944 + 0.041665796) * fStack_944 + 0.16666666) * fStack_944 + 0.5) *
                fStack_944 * fStack_944 + fStack_944 + 1.0) * fStack_974 + 1.0;
          auVar56._0_4_ =
               ((((((local_948 * 0.00019875691 + 0.0013981999) * local_948 + 0.008333452) *
                   local_948 + 0.041665796) * local_948 + 0.16666666) * local_948 + 0.5) *
                local_948 * local_948 + local_948 + 1.0) * local_978 + 1.0;
          auVar56._8_4_ =
               ((((((fStack_940 * 0.00019875691 + 0.0013981999) * fStack_940 + 0.008333452) *
                   fStack_940 + 0.041665796) * fStack_940 + 0.16666666) * fStack_940 + 0.5) *
                fStack_940 * fStack_940 + fStack_940 + 1.0) * fStack_970 + 1.0;
          auVar56._12_4_ =
               ((((((fStack_93c * 0.00019875691 + 0.0013981999) * fStack_93c + 0.008333452) *
                   fStack_93c + 0.041665796) * fStack_93c + 0.16666666) * fStack_93c + 0.5) *
                fStack_93c * fStack_93c + fStack_93c + 1.0) * fStack_96c + 1.0;
          auVar12 = vdivps_avx(auVar57,auVar56);
          local_dc8 = auVar12._0_4_;
          fStack_dc4 = auVar12._4_4_;
          fStack_dc0 = auVar12._8_4_;
          fStack_dbc = auVar12._12_4_;
          auVar95._0_4_ = local_dc8 * 2.0;
          auVar95._4_4_ = fStack_dc4 * 2.0;
          auVar95._8_4_ = fStack_dc0 * 2.0;
          auVar95._12_4_ = fStack_dbc * 2.0;
          auVar63._8_8_ = 0x3f8000003f800000;
          auVar63._0_8_ = 0x3f8000003f800000;
          auVar12 = vsubps_avx(auVar95,auVar63);
          local_1a38 = auVar12._0_4_;
          fStack_1a34 = auVar12._4_4_;
          fStack_1a30 = auVar12._8_4_;
          fStack_1a2c = auVar12._12_4_;
          local_1e28._4_4_ = fStack_1984 * fStack_1a34;
          local_1e28._0_4_ = local_1988 * local_1a38;
          uStack_1e20._0_4_ = fStack_1a20 * fStack_1a30;
          uStack_1e20._4_4_ = fStack_1a1c * fStack_1a2c;
          break;
        case 6:
          fVar91 = *(float *)*in_stack_00000030;
          fVar92 = *(float *)(*in_stack_00000030 + 4);
          local_19e8 = CONCAT44(fStack_1984 * fVar91 + fVar92,local_1988 * fVar91 + fVar92);
          uStack_19e0._0_4_ = fStack_1a20 * fVar91 + fVar92;
          uStack_19e0._4_4_ = fStack_1a1c * fVar91 + fVar92;
          auVar12._8_8_ = uStack_19e0;
          auVar12._0_8_ = local_19e8;
          auVar12 = vmaxps_avx(auVar12,ZEXT816(0));
          auVar10._8_8_ = 0x3f8000003f800000;
          auVar10._0_8_ = 0x3f8000003f800000;
          auVar12 = vminps_avx(auVar12,auVar10);
          local_1978 = auVar12._0_4_;
          fStack_1974 = auVar12._4_4_;
          fStack_1970 = auVar12._8_4_;
          fStack_196c = auVar12._12_4_;
          local_1e28._4_4_ = fStack_1974 * fStack_1984;
          local_1e28._0_4_ = local_1978 * local_1988;
          uStack_1e20._0_4_ = fStack_1970 * fStack_1a20;
          uStack_1e20._4_4_ = fStack_196c * fStack_1a1c;
          break;
        default:
          uStack_1e20 = uStack_2530;
          local_1e28 = (undefined1  [8])local_2538;
        }
        *local_24b0 = local_1e28;
        local_24b0[1] = uStack_1e20;
        local_24b0 = local_24b0 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack8to4_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 8;

                            int k = (y * kernel_w + x) * 32;

                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);
                            __m128 _w0 = _mm_load_ps(kptr + k);
                            __m128 _w1 = _mm_load_ps(kptr + k + 4);
                            __m128 _w2 = _mm_load_ps(kptr + k + 8);
                            __m128 _w3 = _mm_load_ps(kptr + k + 12);
                            __m128 _w4 = _mm_load_ps(kptr + k + 16);
                            __m128 _w5 = _mm_load_ps(kptr + k + 20);
                            __m128 _w6 = _mm_load_ps(kptr + k + 24);
                            __m128 _w7 = _mm_load_ps(kptr + k + 28);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);
                        }
                    }

                    kptr += maxk * 32;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}